

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labpack-reader.c
# Opt level: O2

double labpack_read_double_strict(labpack_reader_t *reader)

{
  double dVar1;
  
  if (reader != (labpack_reader_t *)0x0) {
    if (reader->status == LABPACK_STATUS_OK) {
      dVar1 = mpack_expect_double_strict(reader->decoder);
      labpack_reader_check_decoder(reader);
    }
    else {
      dVar1 = 0.0;
    }
    return dVar1;
  }
  __assert_fail("reader",
                "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/src/labpack-reader.c"
                ,0x130,"double labpack_read_double_strict(labpack_reader_t *)");
}

Assistant:

double
labpack_read_double_strict(labpack_reader_t* reader)
{
    assert(reader);
    double value = 0;
    if (labpack_reader_is_ok(reader)) {
        value = mpack_expect_double_strict(reader->decoder);
        labpack_reader_check_decoder(reader);
    }
    return value;
}